

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb-test.cpp
# Opt level: O1

long __thiscall
cubeb_client::user_data_cb
          (cubeb_client *this,cubeb_stream *stm,void *user,void *input_buffer,void *output_buffer,
          long nframes)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  uint local_64;
  
  iVar6 = (int)nframes;
  if (output_buffer == (void *)0x0 || input_buffer == (void *)0x0) {
    if (output_buffer != (void *)0x0 && input_buffer == (void *)0x0) {
      uVar2 = (this->_channels).super___atomic_base<unsigned_int>._M_i;
      if (iVar6 != 0) {
        uVar1 = this->_total_frames;
        dVar9 = (double)(this->_rate).super___atomic_base<unsigned_int>._M_i;
        local_64 = 0;
        iVar8 = 0;
        do {
          if ((ulong)uVar2 != 0) {
            dVar11 = (double)(uVar1 + iVar8) * 6.283185307179586;
            uVar7 = (ulong)uVar2;
            uVar4 = local_64;
            do {
              dVar10 = sin((dVar11 * 350.0) / dVar9);
              uVar3 = (ulong)uVar4;
              *(float *)((long)output_buffer + uVar3 * 4) = (float)(dVar10 * 0.2);
              dVar10 = sin((dVar11 * 440.0) / dVar9);
              *(float *)((long)output_buffer + uVar3 * 4) =
                   (float)(dVar10 * 0.2 + (double)*(float *)((long)output_buffer + uVar3 * 4));
              uVar4 = uVar4 + 1;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
          iVar8 = iVar8 + 1;
          local_64 = local_64 + uVar2;
        } while (iVar8 != iVar6);
      }
    }
  }
  else if (((this->_latency_testing)._M_base._M_i & 1U) == 0) {
    if (0 < nframes) {
      lVar5 = 0;
      do {
        if ((this->_channels).super___atomic_base<unsigned_int>._M_i != 0) {
          uVar2 = 0;
          do {
            *(undefined4 *)
             ((long)output_buffer +
             (ulong)((this->_channels).super___atomic_base<unsigned_int>._M_i * (int)lVar5 + uVar2)
             * 4) = *(undefined4 *)((long)input_buffer + lVar5 * 4);
            uVar2 = uVar2 + 1;
          } while (uVar2 < (this->_channels).super___atomic_base<unsigned_int>._M_i);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != nframes);
    }
  }
  else if (0 < nframes) {
    lVar5 = 0;
    do {
      iVar8 = (int)lVar5;
      if ((this->_total_frames + iVar8) % (this->_rate).super___atomic_base<unsigned_int>._M_i == 0)
      {
        if ((this->_channels).super___atomic_base<unsigned_int>._M_i != 0) {
          uVar2 = 0;
          do {
            *(float *)((long)output_buffer +
                      (ulong)((this->_channels).super___atomic_base<unsigned_int>._M_i * iVar8 +
                             uVar2) * 4) = *(float *)((long)input_buffer + lVar5 * 4) * 0.5 + 1.0;
            uVar2 = uVar2 + 1;
          } while (uVar2 < (this->_channels).super___atomic_base<unsigned_int>._M_i);
        }
      }
      else if ((this->_channels).super___atomic_base<unsigned_int>._M_i != 0) {
        uVar2 = 0;
        do {
          *(float *)((long)output_buffer +
                    (ulong)((this->_channels).super___atomic_base<unsigned_int>._M_i * iVar8 + uVar2
                           ) * 4) = *(float *)((long)input_buffer + lVar5 * 4) * 0.5 + 0.0;
          uVar2 = uVar2 + 1;
        } while (uVar2 < (this->_channels).super___atomic_base<unsigned_int>._M_i);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != nframes);
  }
  this->_total_frames = this->_total_frames + iVar6;
  return nframes - (ulong)((this->_force_drain)._M_base._M_i & 1);
}

Assistant:

long cubeb_client::user_data_cb(cubeb_stream* stm, void* user,
                                const void* input_buffer, void* output_buffer,
                                long nframes) {
  if (input_buffer && output_buffer) {
    const float* in = static_cast<const float*>(input_buffer);
    float* out = static_cast<float*>(output_buffer);
    if (_latency_testing) {
      for (int32_t i = 0; i < nframes; i++) {
        // Impulses every second, mixed with the input signal fed back at half
        // gain, to measure the input-to-output latency via feedback.
        uint32_t clock = ((_total_frames + i) % _rate);
        if (!clock) {
          for (uint32_t j = 0; j < _channels; j++) {
            out[i * _channels + j] = 1.0 + in[i] * 0.5;
          }
        } else {
          for (uint32_t j = 0; j < _channels; j++) {
            out[i * _channels + j] = 0.0 + in[i] * 0.5;
          }
        }
      }
    } else {
      for (int32_t i = 0; i < nframes; i++) {
        for (uint32_t j = 0; j < _channels; j++) {
          out[i * _channels + j] = in[i];
        }
      }
    }
  } else if (output_buffer && !input_buffer) {
    fill_with_sine_tone(static_cast<float*>(output_buffer), nframes, _channels,
                       _rate, _total_frames);
  }

  _total_frames += nframes;

  if (_force_drain) {
    return nframes - 1;
  }

  return nframes;
}